

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v5::internal::sprintf_format<double>(double value,buffer *buf,core_format_specs spec)

{
  uint uVar1;
  ulong uVar2;
  assertion_failure *this;
  char *pcVar3;
  char format [10];
  char local_2a [10];
  double local_20;
  
  local_20 = value;
  if (buf->capacity_ == 0) {
    this = (assertion_failure *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this,"empty buffer");
    __cxa_throw(this,&assertion_failure::typeinfo,std::logic_error::~logic_error);
  }
  local_2a[0] = '%';
  if (((ulong)spec >> 0x23 & 1) == 0) {
    pcVar3 = local_2a + 1;
  }
  else {
    pcVar3 = local_2a + 2;
    local_2a[1] = 0x23;
  }
  if (-1 < spec.precision) {
    pcVar3[0] = '.';
    pcVar3[1] = '*';
    pcVar3 = pcVar3 + 2;
  }
  *pcVar3 = spec.type;
  pcVar3[1] = '\0';
LAB_0011048b:
  uVar1 = char_traits<char>::format_float<double>
                    (buf->ptr_,buf->capacity_,local_2a,spec.precision,local_20);
  if ((int)uVar1 < 0) goto LAB_001104b4;
  if ((ulong)uVar1 < buf->capacity_) {
    buf->size_ = (ulong)uVar1;
    return;
  }
  uVar2 = (ulong)(uVar1 + 1);
  goto LAB_001104c1;
LAB_001104b4:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar2 = buf->capacity_ + 1;
LAB_001104c1:
    (**buf->_vptr_basic_buffer)(buf,uVar2);
  }
  goto LAB_0011048b;
}

Assistant:

void sprintf_format(Double value, internal::buffer &buf,
                    core_format_specs spec) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() != 0, "empty buffer");

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  char format[MAX_FORMAT_SIZE];
  char *format_ptr = format;
  *format_ptr++ = '%';
  if (spec.has(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<Double, long double>::value)
    *format_ptr++ = 'L';
  *format_ptr++ = spec.type;
  *format_ptr = '\0';

  // Format using snprintf.
  char *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buf.capacity();
    start = &buf[0];
    int result = internal::char_traits<char>::format_float(
        start, buffer_size, format, spec.precision, value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buf.capacity()) {
        buf.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buf.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buf.reserve(buf.capacity() + 1);
    }
  }
}